

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::Maybe<capnproto_test::capnp::test::TestMoreStuff::Client>::Maybe
          (Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *this,
          Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *other)

{
  kj::_::NullableValue<capnproto_test::capnp::test::TestMoreStuff::Client>::NullableValue
            (&this->ptr,&other->ptr);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }